

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateInfoSetCoreTypeFromString
               (HelicsFederateInfo fedInfo,char *coretype,HelicsError *err)

{
  CoreType CVar1;
  FederateInfo *pFVar2;
  core *this;
  char *pcVar3;
  char *extraout_RDX;
  string_view type;
  string_view newError;
  allocator<char> local_69;
  MasterObjectHolder *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pFVar2 = getFedInfo(fedInfo,err);
  if (pFVar2 != (FederateInfo *)0x0) {
    if (coretype == (char *)0x0) {
      pFVar2->coreType = DEFAULT;
    }
    else {
      this = (core *)strlen(coretype);
      type._M_str = extraout_RDX;
      type._M_len = (size_t)coretype;
      CVar1 = helics::core::coreTypeFromString(this,type);
      if (err == (HelicsError *)0x0 || CVar1 != UNRECOGNIZED) {
        pFVar2->coreType = CVar1;
      }
      else {
        err->error_code = -4;
        getMasterHolder();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,coretype,&local_69);
        std::operator+(&local_58,&local_38," is not a valid core type");
        newError._M_str = local_58._M_dataplus._M_p;
        newError._M_len = local_58._M_string_length;
        pcVar3 = MasterObjectHolder::addErrorString(local_68,newError);
        err->message = pcVar3;
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetCoreTypeFromString(HelicsFederateInfo fedInfo, const char* coretype, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    if (coretype == nullptr) {
        info->coreType = helics::CoreType::DEFAULT;
        return;
    }
    auto ctype = helics::core::coreTypeFromString(coretype);
    if (ctype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(coretype) + " is not a valid core type");
            return;
        }
    }
    info->coreType = ctype;
}